

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armci.c
# Opt level: O0

int armci_check_contiguous(int *src_stride,int *dst_stride,int *count,int n_stride)

{
  bool bVar1;
  long lVar2;
  int tmp;
  int dst_ld [7];
  int src_ld [7];
  int gap;
  int stridelen;
  int ret;
  int i;
  int n_stride_local;
  int *count_local;
  int *dst_stride_local;
  int *src_stride_local;
  
  ret = 1;
  stridelen = 1;
  bVar1 = false;
  src_ld[0] = *src_stride;
  dst_ld[0] = *dst_stride;
  for (i = 1; i < n_stride; i = i + 1) {
    src_ld[i] = src_stride[i] / src_stride[i + -1];
    dst_ld[i] = dst_stride[i] / dst_stride[i + -1];
  }
  i = 0;
  do {
    if (n_stride <= i) {
LAB_001c244f:
      if ((((bVar1) && (ret == 1)) && (0 < n_stride)) && (count[n_stride] != 1)) {
        ret = 0;
      }
      return ret;
    }
    lVar2 = (long)i;
    if ((stridelen != 0) && ((stridelen * count[lVar2]) / stridelen != count[i])) {
      ret = 0;
      goto LAB_001c244f;
    }
    if (((count[i] < src_ld[i]) || (count[i] < dst_ld[i])) && (bVar1)) {
      ret = 0;
      goto LAB_001c244f;
    }
    if (((src_ld[i] <= count[i]) && (dst_ld[i] <= count[i])) || (bVar1)) {
      if ((count[i] != 1) && (bVar1)) {
        ret = 0;
        goto LAB_001c244f;
      }
    }
    else {
      bVar1 = true;
    }
    i = i + 1;
    stridelen = stridelen * count[lVar2];
  } while( true );
}

Assistant:

int armci_check_contiguous(int *src_stride, int *dst_stride,
    int *count, int n_stride)
{
#if 1
  /* This is code from the merge between CMX and the current develop branch
   * (2018/7/5) */
  int i;
  int ret = 1;
  int stridelen = 1;
  int gap = 0;
  int src_ld[7], dst_ld[7];
  /**
   * Calculate physical dimensions of buffers from stride arrays
   */
  src_ld[0] = src_stride[0];
  dst_ld[0] = dst_stride[0];
  for (i=1; i<n_stride; i++) {
    src_ld[i] = src_stride[i]/src_stride[i-1];
    dst_ld[i] = dst_stride[i]/dst_stride[i-1];
  }
  /* NOTE: The count array contains the length of the final dimension and can
   * be used to evaluate some corner cases
   */
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if ((count[i] < src_ld[i] || count[i] < dst_ld[i])
        && gap == 1) {
      /* Data is definitely strided in memory */
      ret = 0;
      break;
    } else if ((count[i] < src_ld[i] || count[i] < dst_ld[i]) &&
        gap == 0) {
      /* First dimension that doesn't match physical dimension */
      gap = 1;
    } else if (count[i] != 1 && gap == 1) {
      /* Found a mismatch between requested block and physical dimensions
       * indicating a possible stride in memory
       * */
      ret = 0;
      break;
    }
  }
  /**
   * Everything looks good up to this point but need to verify that last
   * dimension is 1 if a mismatch between requested block and physical
   * array dimensions has been found previously
   */
  if (gap == 1 && ret == 1 && n_stride > 0) {
    if (count[n_stride] != 1) ret = 0;
  }
  return ret;
#else
  int i;
  int ret = 1;
  int stridelen = 1;
  /* NOTE: The count array contains the length of the final dimension and could
   * be used to evaluate some corner cases that are not picked up by this
   * algorithm
   */ 
  for (i=0; i<n_stride; i++) {
    /* check for overflow */
    int tmp = stridelen * count[i];
    if (stridelen != 0 && tmp / stridelen != count[i]) {
      ret = 0;
      break;
    }
    stridelen = tmp;
    if (stridelen < src_stride[i] || stridelen < dst_stride[i]) {
      ret = 0;
      break;
    }
  }
  return ret;
#endif
}